

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.hxx
# Opt level: O3

void __thiscall
SpikingNeuron::SpikingNeuron(SpikingNeuron *this,Time *time,string *name,string *type)

{
  pointer pcVar1;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (type->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + type->_M_string_length);
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR___cxa_pure_virtual_0015c4e8;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  StochasticProcess::StochasticProcess
            ((StochasticProcess *)&this->super_StochasticEventGenerator,time,name,type);
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR___cxa_pure_virtual_0015c370;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__SpikingNeuron_0015c3a0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__SpikingNeuron_0015c438;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__SpikingNeuron_0015c480;
  return;
}

Assistant:

SpikingNeuron (
		Time *time,   ///< global time object
		string name,   ///< object name
		string type="Spiking Neuron"   ///< object type
	) : Neuron(name, type), StochasticEventGenerator(time, name, type) {}